

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O3

err_t BufRead(bufstream *p,uint8_t *Data,size_t Size,size_t *Readed)

{
  size_t *psVar1;
  stream *psVar2;
  err_t eVar3;
  err_t eVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong local_38;
  
  if (Size == 0) {
    eVar3 = 0;
    uVar6 = 0;
  }
  else {
    psVar1 = &p->ReadSize;
    uVar7 = p->ReadPos;
    uVar8 = 0;
    eVar3 = 0;
    sVar9 = Size;
    do {
      uVar5 = *psVar1;
      if (uVar5 <= uVar7) {
        if (0x1000 < sVar9) {
          psVar2 = p->Stream;
          local_38 = sVar9;
          if (psVar2 == (stream *)0x0) {
            __assert_fail("(const void*)(p->Stream)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                          ,0x41,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
          }
          eVar3 = (**(code **)((long)(psVar2->Base).VMT + 0x58))
                            (psVar2,Data + uVar8,sVar9,&local_38);
          if (Readed == (size_t *)0x0) {
            return eVar3;
          }
          *Readed = uVar8 + local_38;
          return eVar3;
        }
        p->ReadPos = 0;
        psVar2 = p->Stream;
        if (psVar2 == (stream *)0x0) {
          __assert_fail("(const void*)(p->Stream)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                        ,0x48,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
        }
        eVar3 = (**(code **)((long)(psVar2->Base).VMT + 0x58))(psVar2,p->Buffer,0x1000,psVar1);
        uVar5 = *psVar1;
        uVar6 = uVar8;
        if (uVar5 == 0) break;
        uVar7 = p->ReadPos;
      }
      uVar6 = uVar5 - uVar7;
      if (sVar9 < uVar5 - uVar7) {
        uVar6 = sVar9;
      }
      memcpy(Data + uVar8,p->Buffer + uVar7,uVar6);
      uVar8 = uVar8 + uVar6;
      uVar7 = uVar6 + p->ReadPos;
      p->ReadPos = uVar7;
      sVar9 = Size - uVar8;
      uVar6 = Size;
    } while (sVar9 != 0);
  }
  if (Readed != (size_t *)0x0) {
    *Readed = uVar6;
  }
  eVar4 = 0;
  if (uVar6 < Size) {
    eVar4 = eVar3;
  }
  return eVar4;
}

Assistant:

static err_t BufRead(bufstream* p,uint8_t* Data,size_t Size,size_t* Readed)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->ReadSize <= p->ReadPos)
        {
            if (Left > BUFSTREAM_SIZE)
            {
                Err = Stream_Read(p->Stream,Data+Pos,Left,&Left);
                if (Readed)
                    *Readed = Pos+Left;
                return Err;
            }

            p->ReadPos = 0;
            Err = Stream_Read(p->Stream,p->Buffer,BUFSTREAM_SIZE,&p->ReadSize);
            if (p->ReadSize <= 0)
                break;
        }

        if (Left > p->ReadSize - p->ReadPos)
            Left = p->ReadSize - p->ReadPos;

        memcpy(Data+Pos,p->Buffer+p->ReadPos,Left);
        Pos += Left;
        p->ReadPos += Left;
    }

    if (Readed)
        *Readed = Pos;

    if (Pos >= Size)
        Err = ERR_NONE; //override possible end of file in later of the buffer
    return Err;
}